

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

string * __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry::AsString_abi_cxx11_
          (string *__return_storage_ptr__,SymbolEntry *this,DescriptorIndex *index)

{
  AlphaNum *in_R8;
  bool bVar1;
  StringPiece local_b8;
  AlphaNum local_88;
  StringPiece local_58 [3];
  
  local_58[0] = package(this,index);
  bVar1 = local_58[0].length_ != 0;
  local_88.piece_data_ = "";
  if (bVar1) {
    local_88.piece_data_ = ".";
  }
  local_88.piece_size_ = (size_t)bVar1;
  local_b8 = symbol(this,index);
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)local_58,&local_88,(AlphaNum *)&local_b8,
                    in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string AsString(const DescriptorIndex& index) const {
      auto p = package(index);
      return StrCat(p, p.empty() ? "" : ".", symbol(index));
    }